

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

bool __thiscall
RootIndexProxyModel::insertRows(RootIndexProxyModel *this,int row,int count,QModelIndex *parent)

{
  RootIndexProxyModelPrivate *pRVar1;
  bool bVar2;
  undefined1 uVar3;
  long lVar4;
  long *plVar5;
  QModelIndex local_40;
  
  lVar4 = QAbstractProxyModel::sourceModel();
  if (lVar4 == 0) {
    uVar3 = 0;
  }
  else {
    pRVar1 = this->m_dptr;
    local_40.r = -1;
    local_40.c = -1;
    local_40.i = 0;
    local_40.m = (QAbstractItemModel *)0x0;
    bVar2 = QModelIndex::isValid(parent);
    if (bVar2) {
      (**(code **)(*(long *)this + 400))(&local_40,this,parent);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&pRVar1->m_rootIndex);
    }
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    uVar3 = (**(code **)(*plVar5 + 0xf8))(plVar5,row,count,&local_40);
  }
  return (bool)uVar3;
}

Assistant:

bool RootIndexProxyModel::insertRows(int row, int count, const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return 0;
    Q_D(RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->insertRows(row, count, sourceParent);
}